

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

_Bool fy_tag_handle_is_default(char *handle,size_t handle_size)

{
  fy_tag *pfVar1;
  int iVar2;
  size_t sVar3;
  fy_tag *fytag;
  size_t sStack_20;
  int i;
  size_t handle_size_local;
  char *handle_local;
  
  sStack_20 = handle_size;
  if (handle_size == 0xffffffffffffffff) {
    sStack_20 = strlen(handle);
  }
  fytag._4_4_ = 0;
  while( true ) {
    pfVar1 = fy_default_tags[fytag._4_4_];
    if (pfVar1 == (fy_tag *)0x0) {
      return false;
    }
    sVar3 = strlen(pfVar1->handle);
    if ((sStack_20 == sVar3) && (iVar2 = memcmp(handle,pfVar1->handle,sStack_20), iVar2 == 0))
    break;
    fytag._4_4_ = fytag._4_4_ + 1;
  }
  return true;
}

Assistant:

bool fy_tag_handle_is_default(const char *handle, size_t handle_size) {
    int i;
    const struct fy_tag *fytag;

    if (handle_size == (size_t) -1)
        handle_size = strlen(handle);

    for (i = 0; (fytag = fy_default_tags[i]) != NULL; i++) {

        if (handle_size == strlen(fytag->handle) &&
            !memcmp(handle, fytag->handle, handle_size))
            return true;

    }
    return false;
}